

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O3

void __thiscall gvr::ColoredMesh::savePLY(ColoredMesh *this,char *name,bool all,ply_encoding enc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_01;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_02;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_03;
  void *pvVar2;
  void *__buf_08;
  void *__buf_09;
  void *extraout_RDX_04;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  int iVar3;
  string *name_00;
  long lVar4;
  long lVar5;
  PLYWriter ply;
  string local_290;
  PLYWriter local_270;
  
  PLYWriter::PLYWriter(&local_270);
  PLYWriter::open(&local_270,name,enc);
  Model::setOriginToPLY((Model *)this,&local_270);
  paVar1 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"vertex","");
  PLYWriter::addElement(&local_270,&local_290,(long)(this->super_Mesh).super_PointCloud.n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"x","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"y","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"z","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
    if (!all) goto LAB_0011fd1e;
  }
  else {
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"scan_size","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (!all) goto LAB_0011fd1e;
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"scan_error","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"scan_conf","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
  }
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"sx","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"sy","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"sz","");
    PLYWriter::addProperty(&local_270,&local_290,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"nx","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"ny","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"nz","");
  PLYWriter::addProperty(&local_270,&local_290,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
LAB_0011fd1e:
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"diffuse_red","");
  PLYWriter::addProperty(&local_270,&local_290,ply_uint8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"diffuse_green","");
  PLYWriter::addProperty(&local_270,&local_290,ply_uint8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"diffuse_blue","");
  PLYWriter::addProperty(&local_270,&local_290,ply_uint8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"face","");
  PLYWriter::addElement(&local_270,&local_290,(long)(this->super_Mesh).n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"vertex_indices","");
  name_00 = &local_290;
  __n = 6;
  PLYWriter::addProperty(&local_270,name_00,ply_uint8,ply_uint32);
  pvVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
    pvVar2 = extraout_RDX_00;
  }
  iVar3 = (int)name_00;
  if (0 < (this->super_Mesh).super_PointCloud.n) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      iVar3 = (int)name_00;
      PLYWriter::write(&local_270,iVar3,pvVar2,__n);
      PLYWriter::write(&local_270,iVar3,__buf,__n);
      PLYWriter::write(&local_270,iVar3,__buf_00,__n);
      if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
        pvVar2 = __buf_01;
        if (all) goto LAB_0011ff0e;
      }
      else {
        PLYWriter::write(&local_270,iVar3,__buf_01,__n);
        pvVar2 = __buf_02;
        if (all) {
          PLYWriter::write(&local_270,iVar3,__buf_02,__n);
          PLYWriter::write(&local_270,iVar3,__buf_03,__n);
          pvVar2 = extraout_RDX_01;
LAB_0011ff0e:
          if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
            PLYWriter::write(&local_270,iVar3,pvVar2,__n);
            PLYWriter::write(&local_270,iVar3,__buf_04,__n);
            PLYWriter::write(&local_270,iVar3,__buf_05,__n);
            pvVar2 = extraout_RDX_02;
          }
          PLYWriter::write(&local_270,iVar3,pvVar2,__n);
          PLYWriter::write(&local_270,iVar3,__buf_06,__n);
          PLYWriter::write(&local_270,iVar3,__buf_07,__n);
          pvVar2 = extraout_RDX_03;
        }
      }
      PLYWriter::write(&local_270,(uint)this->rgb[lVar5],pvVar2,__n);
      PLYWriter::write(&local_270,(uint)this->rgb[lVar5 + 1],__buf_08,__n);
      name_00 = (string *)(ulong)this->rgb[lVar5 + 2];
      PLYWriter::write(&local_270,(uint)this->rgb[lVar5 + 2],__buf_09,__n);
      iVar3 = (int)name_00;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 3;
      pvVar2 = extraout_RDX_04;
    } while (lVar4 < (this->super_Mesh).super_PointCloud.n);
  }
  if (0 < (this->super_Mesh).n) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      PLYWriter::writeListSize(&local_270,3);
      PLYWriter::write(&local_270,*(int *)((long)(this->super_Mesh).triangle + lVar5),__buf_10,__n);
      PLYWriter::write(&local_270,*(int *)((long)(this->super_Mesh).triangle + lVar5 + 4),__buf_11,
                       __n);
      iVar3 = *(int *)((long)(this->super_Mesh).triangle + lVar5 + 8);
      PLYWriter::write(&local_270,iVar3,__buf_12,__n);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar4 < (this->super_Mesh).n);
  }
  PLYWriter::close(&local_270,iVar3);
  PLYWriter::~PLYWriter(&local_270);
  return;
}

Assistant:

void ColoredMesh::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define data

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addProperty("diffuse_red", ply_uint8);
  ply.addProperty("diffuse_green", ply_uint8);
  ply.addProperty("diffuse_blue", ply_uint8);

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }

    ply.write(getColorComp(i, 0));
    ply.write(getColorComp(i, 1));
    ply.write(getColorComp(i, 2));
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}